

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::interval_t,duckdb::interval_t,duckdb::UnaryOperatorWrapper,duckdb::NegateOperator>
               (interval_t *ldata,interval_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ulong uVar4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  interval_t input;
  interval_t input_00;
  interval_t iVar13;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar7 = 8;
      do {
        iVar13.micros = *(int64_t *)((long)&ldata->months + lVar7);
        iVar13._0_8_ = *(undefined8 *)((long)ldata + lVar7 + -8);
        iVar13 = NegateOperator::Operation<duckdb::interval_t,duckdb::interval_t>(iVar13);
        *(long *)((long)result_data + lVar7 + -8) = iVar13._0_8_;
        *(int64_t *)((long)&result_data->months + lVar7) = iVar13.micros;
        lVar7 = lVar7 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_48,(unsigned_long **)mask,&local_38);
      p_Var3 = p_Stack_40;
      peVar2 = local_48;
      local_48 = (element_type *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar2;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
      pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar5->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      uVar10 = 0;
      uVar6 = 0;
      do {
        puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar12 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar12 = count;
          }
LAB_0107a860:
          uVar4 = uVar10;
          if (uVar10 < uVar12) {
            uVar8 = uVar10 << 4 | 8;
            do {
              input.micros = *(int64_t *)((long)&ldata->months + uVar8);
              input._0_8_ = *(undefined8 *)((long)ldata + (uVar8 - 8));
              iVar13 = NegateOperator::Operation<duckdb::interval_t,duckdb::interval_t>(input);
              *(long *)((long)result_data + (uVar8 - 8)) = iVar13._0_8_;
              *(int64_t *)((long)&result_data->months + uVar8) = iVar13.micros;
              uVar10 = uVar10 + 1;
              uVar8 = uVar8 + 0x10;
              uVar4 = uVar12;
            } while (uVar12 != uVar10);
          }
        }
        else {
          uVar8 = puVar1[uVar6];
          uVar12 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar12 = count;
          }
          uVar4 = uVar12;
          if (uVar8 != 0) {
            if (uVar8 == 0xffffffffffffffff) goto LAB_0107a860;
            uVar4 = uVar10;
            if (uVar10 < uVar12) {
              uVar11 = uVar10 << 4 | 8;
              uVar9 = 0;
              do {
                if ((uVar8 >> (uVar9 & 0x3f) & 1) != 0) {
                  input_00.micros = *(int64_t *)((long)&ldata->months + uVar11);
                  input_00._0_8_ = *(undefined8 *)((long)ldata + (uVar11 - 8));
                  iVar13 = NegateOperator::Operation<duckdb::interval_t,duckdb::interval_t>
                                     (input_00);
                  *(long *)((long)result_data + (uVar11 - 8)) = iVar13._0_8_;
                  *(int64_t *)((long)&result_data->months + uVar11) = iVar13.micros;
                }
                uVar9 = uVar9 + 1;
                uVar11 = uVar11 + 0x10;
                uVar4 = uVar12;
              } while (uVar12 - uVar10 != uVar9);
            }
          }
        }
        uVar10 = uVar4;
        uVar6 = uVar6 + 1;
      } while (uVar6 != count + 0x3f >> 6);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}